

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<wchar_t>::print_ldfa(Grammar<wchar_t> *this,wostream *os,ATNPath *path)

{
  CompositeATN<wchar_t> *this_00;
  Identifier *this_01;
  wstring *graph_name;
  undefined1 local_88 [8];
  LookaheadDFA<wchar_t> ldfa;
  CompositeATN<wchar_t> catn;
  ATNPath *path_local;
  wostream *os_local;
  Grammar<wchar_t> *this_local;
  
  this_00 = (CompositeATN<wchar_t> *)
            &ldfa.super_NFABase<Centaurus::LDFAState<wchar_t>_>.m_states.
             super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  CompositeATN<wchar_t>::CompositeATN(this_00,this);
  LookaheadDFA<wchar_t>::LookaheadDFA((LookaheadDFA<wchar_t> *)local_88,this_00,path,true);
  this_01 = ATNPath::leaf_id(path);
  graph_name = Identifier::str_abi_cxx11_(this_01);
  LookaheadDFA<wchar_t>::print((LookaheadDFA<wchar_t> *)local_88,os,graph_name);
  LookaheadDFA<wchar_t>::~LookaheadDFA((LookaheadDFA<wchar_t> *)local_88);
  CompositeATN<wchar_t>::~CompositeATN
            ((CompositeATN<wchar_t> *)
             &ldfa.super_NFABase<Centaurus::LDFAState<wchar_t>_>.m_states.
              super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Grammar<TCHAR>::print_ldfa(std::wostream& os, const ATNPath& path) const
{
    CompositeATN<TCHAR> catn(*this);

    LookaheadDFA<TCHAR> ldfa(catn, path);

    ldfa.print(os, path.leaf_id().str());
}